

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandLutpack(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int c;
  Lpk_Par_t *pPars;
  Lpk_Par_t Pars;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._40_8_ = Abc_FrameReadNtk(pAbc);
  Pars._40_8_ = Abc_FrameReadNtk(pAbc);
  memset((Lpk_Par_t *)&pPars,0,0x30);
  pPars._0_4_ = 4;
  pPars._4_4_ = 3;
  Pars.nLutsMax = 0;
  Pars.nLutsOver = 0;
  Pars.nVarsShared = 1;
  Pars.nGrowthLevel = 0;
  Pars.fSatur = 0;
  Pars.fZeroCost = 0;
  Pars.fFirst = 0;
  Pars.fOldAlgo = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"NQSLszfovwh");
    if (iVar1 == -1) {
      if (Pars._40_8_ == 0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsLogic((Abc_Ntk_t *)Pars._40_8_);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command can only be applied to a logic network.\n");
        return 1;
      }
      if ((-1 < Pars.nLutsMax) && (Pars.nLutsMax < 4)) {
        iVar1 = Lpk_Resynthesize((Abc_Ntk_t *)Pars._40_8_,(Lpk_Par_t *)&pPars);
        if (iVar1 == 0) {
          Abc_Print(-1,"Resynthesis has failed.\n");
          return 1;
        }
        return 0;
      }
      Abc_Print(-1,"The number of shared variables (%d) is not in the range 0 <= S <= 3.\n",
                (ulong)(uint)Pars.nLutsMax);
      return 1;
    }
    switch(iVar1) {
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
LAB_00268385:
        Abc_Print(-2,"usage: lutpack [-NQSL <num>] [-szfovwh]\n");
        Abc_Print(-2,"\t           performs \"rewriting\" for LUT network;\n");
        Abc_Print(-2,"\t           determines LUT size as the max fanin count of a node;\n");
        Abc_Print(-2,"\t           if the network is not LUT-mapped, packs it into 6-LUTs\n");
        Abc_Print(-2,
                  "\t           (there is another command for resynthesis after LUT mapping, \"mfs2\")\n"
                 );
        Abc_Print(-2,
                  "\t-N <num> : the max number of LUTs in the structure (2 <= num) [default = %d]\n"
                  ,(ulong)(uint)pPars);
        Abc_Print(-2,"\t-Q <num> : the max number of LUTs not in MFFC (0 <= num) [default = %d]\n",
                  (ulong)pPars._4_4_);
        Abc_Print(-2,
                  "\t-S <num> : the max number of LUT inputs shared (0 <= num <= 3) [default = %d]\n"
                  ,(ulong)(uint)Pars.nLutsMax);
        Abc_Print(-2,"\t-L <num> : max level increase after resynthesis (0 <= num) [default = %d]\n"
                  ,(ulong)(uint)Pars.nLutsOver);
        pcVar2 = "no";
        if (Pars.nVarsShared != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-s       : toggle iteration till saturation [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.nGrowthLevel != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-z       : toggle zero-cost replacements [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fSatur != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-f       : toggle using only first node and first cut [default = %s]\n",
                  pcVar2);
        pcVar2 = "no";
        if (Pars.fZeroCost != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-o       : toggle using old implementation [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fFirst != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar2);
        pcVar2 = "no";
        if (Pars.fOldAlgo != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,
                  "\t-w       : toggle detailed printout of decomposed functions [default = %s]\n",
                  pcVar2);
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
      Pars.nLutsOver = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((Pars.nLutsOver < 0) || (1000000000 < Pars.nLutsOver)) goto LAB_00268385;
      break;
    default:
      goto LAB_00268385;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_00268385;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (((int)(uint)pPars < 2) || (0x10 < (int)(uint)pPars)) goto LAB_00268385;
      break;
    case 0x51:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-Q\" should be followed by an integer.\n");
        goto LAB_00268385;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (((int)pPars._4_4_ < 0) || (8 < (int)pPars._4_4_)) goto LAB_00268385;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_00268385;
      }
      Pars.nLutsMax = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((Pars.nLutsMax < 0) || (4 < Pars.nLutsMax)) goto LAB_00268385;
      break;
    case 0x66:
      Pars.fSatur = Pars.fSatur ^ 1;
      break;
    case 0x68:
      goto LAB_00268385;
    case 0x6f:
      Pars.fZeroCost = Pars.fZeroCost ^ 1;
      break;
    case 0x73:
      Pars.nVarsShared = Pars.nVarsShared ^ 1;
      break;
    case 0x76:
      Pars.fFirst = Pars.fFirst ^ 1;
      break;
    case 0x77:
      Pars.fOldAlgo = Pars.fOldAlgo ^ 1;
      break;
    case 0x7a:
      Pars.nGrowthLevel = Pars.nGrowthLevel ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandLutpack( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Lpk_Par_t Pars, * pPars = &Pars;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    memset( pPars, 0, sizeof(Lpk_Par_t) );
    pPars->nLutsMax     =  4; // (N) the maximum number of LUTs in the structure
    pPars->nLutsOver    =  3; // (Q) the maximum number of LUTs not in the MFFC
    pPars->nVarsShared  =  0; // (S) the maximum number of shared variables (crossbars)
    pPars->nGrowthLevel =  0; // (L) the maximum number of increased levels
    pPars->fSatur       =  1;
    pPars->fZeroCost    =  0;
    pPars->fFirst       =  0;
    pPars->fOldAlgo     =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NQSLszfovwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutsMax < 2 || pPars->nLutsMax > 16 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutsOver = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutsOver < 0 || pPars->nLutsOver > 8 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVarsShared = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVarsShared < 0 || pPars->nVarsShared > 4 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < 0 || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 's':
            pPars->fSatur ^= 1;
            break;
        case 'z':
            pPars->fZeroCost ^= 1;
            break;
        case 'f':
            pPars->fFirst ^= 1;
            break;
        case 'o':
            pPars->fOldAlgo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( pPars->nVarsShared < 0 || pPars->nVarsShared > 3 )
    {
        Abc_Print( -1, "The number of shared variables (%d) is not in the range 0 <= S <= 3.\n", pPars->nVarsShared );
        return 1;
    }

    // modify the current network
    if ( !Lpk_Resynthesize( pNtk, pPars ) )
    {
        Abc_Print( -1, "Resynthesis has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: lutpack [-NQSL <num>] [-szfovwh]\n" );
    Abc_Print( -2, "\t           performs \"rewriting\" for LUT network;\n" );
    Abc_Print( -2, "\t           determines LUT size as the max fanin count of a node;\n" );
    Abc_Print( -2, "\t           if the network is not LUT-mapped, packs it into 6-LUTs\n" );
    Abc_Print( -2, "\t           (there is another command for resynthesis after LUT mapping, \"mfs2\")\n" );
    Abc_Print( -2, "\t-N <num> : the max number of LUTs in the structure (2 <= num) [default = %d]\n", pPars->nLutsMax );
    Abc_Print( -2, "\t-Q <num> : the max number of LUTs not in MFFC (0 <= num) [default = %d]\n", pPars->nLutsOver );
    Abc_Print( -2, "\t-S <num> : the max number of LUT inputs shared (0 <= num <= 3) [default = %d]\n", pPars->nVarsShared );
    Abc_Print( -2, "\t-L <num> : max level increase after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-s       : toggle iteration till saturation [default = %s]\n", pPars->fSatur? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggle zero-cost replacements [default = %s]\n", pPars->fZeroCost? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggle using only first node and first cut [default = %s]\n", pPars->fFirst? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggle using old implementation [default = %s]\n", pPars->fOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle detailed printout of decomposed functions [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}